

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name)

{
  bool bVar1;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(&local_38);
  if (local_38._M_string_length != 0) {
    bVar1 = std::operator==(&local_38,".");
    if (!bVar1) {
      std::__cxx11::string::append((char *)&local_38);
      std::__cxx11::string::append((string *)&local_38);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_38._M_string_length;
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      goto LAB_0038c0af;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
LAB_0038c0af:
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name) const
{
  std::string path = this->GetTargetOutputDir();
  if (path.empty() || path == ".") {
    return name;
  }
  path += "/";
  path += name;
  return path;
}